

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bits * __thiscall lan::db::find_rec(db *this,string *address,db_bit_type type,db_bit *ref)

{
  db_bit *pdVar1;
  db_bits *pdVar2;
  string *name;
  string string;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  find__pop_address(&sStack_a8,(db *)address,address);
  if (address->_M_string_length == 0) {
    name = &local_48;
    std::__cxx11::string::string((string *)name,(string *)&sStack_a8);
    pdVar2 = find_any(this,name,type,ref);
LAB_0010b828:
    std::__cxx11::string::~string((string *)name);
  }
  else {
    if (sStack_a8._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_88,(string *)&sStack_a8);
      pdVar1 = find_any(this,&local_88,type,ref);
      std::__cxx11::string::~string((string *)&local_88);
      if (pdVar1 != (db_bit *)0x0) {
        name = &local_68;
        std::__cxx11::string::string((string *)name,(string *)address);
        pdVar2 = find_rec(this,name,type,pdVar1->lin);
        goto LAB_0010b828;
      }
    }
    pdVar2 = (db_bits *)0x0;
  }
  std::__cxx11::string::~string((string *)&sStack_a8);
  return pdVar2;
}

Assistant:

lan::db_bits * db::find_rec(std::string address, lan::db_bit_type const type, lan::db_bit * ref){
            std::string string = find__pop_address(address);
            if(address.empty()) {
                return find_any(string, type, ref);
            } else if(not string.empty()) {
                if((ref = find_any(string, type, ref))){
                    return find_rec(address, type, ref->lin);
                }
            } return nullptr;
        }